

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_tables.cpp
# Opt level: O0

float ImGui::TableGetColumnWidthAuto(ImGuiTable *table,ImGuiTableColumn *column)

{
  uint *in_RSI;
  long in_RDI;
  float fVar1;
  float width_auto;
  float content_width_headers;
  float content_width_body;
  float local_1c;
  
  local_1c = ImMax<float>((float)in_RSI[0x10],(float)in_RSI[0x11]);
  local_1c = local_1c - (float)in_RSI[0xd];
  if ((*in_RSI & 0x2000) == 0) {
    local_1c = ImMax<float>(local_1c,(float)in_RSI[0x13] - (float)in_RSI[0xd]);
  }
  if ((((*in_RSI & 0x10) != 0) && (0.0 < (float)in_RSI[7])) &&
     (((*(uint *)(in_RDI + 4) & 1) == 0 || ((*in_RSI & 0x20) != 0)))) {
    local_1c = (float)in_RSI[7];
  }
  fVar1 = ImMax<float>(local_1c,*(float *)(in_RDI + 0xbc));
  return fVar1;
}

Assistant:

float ImGui::TableGetColumnWidthAuto(ImGuiTable* table, ImGuiTableColumn* column)
{
    const float content_width_body = ImMax(column->ContentMaxXFrozen, column->ContentMaxXUnfrozen) - column->WorkMinX;
    const float content_width_headers = column->ContentMaxXHeadersIdeal - column->WorkMinX;
    float width_auto = content_width_body;
    if (!(column->Flags & ImGuiTableColumnFlags_NoHeaderWidth))
        width_auto = ImMax(width_auto, content_width_headers);

    // Non-resizable fixed columns preserve their requested width
    if ((column->Flags & ImGuiTableColumnFlags_WidthFixed) && column->InitStretchWeightOrWidth > 0.0f)
        if (!(table->Flags & ImGuiTableFlags_Resizable) || (column->Flags & ImGuiTableColumnFlags_NoResize))
            width_auto = column->InitStretchWeightOrWidth;

    return ImMax(width_auto, table->MinColumnWidth);
}